

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O1

void sum_cols_int_check_nulls(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  AssertionHandler catchAssertionHandler;
  int local_dc;
  sqlite3_context *local_d8;
  undefined4 local_cc;
  SourceLineInfo local_c8;
  AssertionHandler local_b8;
  ITransientExpression local_70;
  int *local_60;
  char *local_58;
  size_t sStack_50;
  undefined4 *local_48;
  StringRef local_40;
  
  local_70._vptr_ITransientExpression = (_func_int **)0x18546e;
  local_70.m_isBinaryExpression = true;
  local_70.m_result = false;
  local_70._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_c8.line = 0x18;
  local_dc = argc;
  local_d8 = context;
  Catch::StringRef::StringRef(&local_40,"argc > 0");
  Catch::AssertionHandler::AssertionHandler
            (&local_b8,(StringRef *)&local_70,&local_c8,local_40,Normal);
  iVar2 = local_dc;
  local_cc = 0;
  Catch::StringRef::StringRef((StringRef *)&local_c8,">");
  local_70.m_result = 0 < iVar2;
  local_70.m_isBinaryExpression = true;
  local_70._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001b6c70;
  local_58 = local_c8.file;
  sStack_50 = local_c8.line;
  local_60 = &local_dc;
  local_48 = &local_cc;
  Catch::AssertionHandler::handleExpr(&local_b8,&local_70);
  Catch::ITransientExpression::~ITransientExpression(&local_70);
  Catch::AssertionHandler::complete(&local_b8);
  if (local_b8.m_completed == false) {
    (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  if (local_dc < 1) {
    iVar2 = 0;
    bVar5 = false;
  }
  else {
    lVar4 = 0;
    iVar3 = 1;
    iVar2 = 0;
    do {
      iVar1 = duckdb_shell_sqlite3_value_type(argv[lVar4]);
      if (iVar1 == 5) {
        iVar3 = 5;
      }
      else {
        iVar1 = duckdb_shell_sqlite3_value_int(argv[lVar4]);
        iVar2 = iVar2 + iVar1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < local_dc);
    bVar5 = iVar3 == 5;
  }
  if (bVar5) {
    duckdb_shell_sqlite3_result_null(local_d8);
  }
  else {
    duckdb_shell_sqlite3_result_int(local_d8,iVar2);
  }
  return;
}

Assistant:

static void sum_cols_int_check_nulls(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc > 0);
	auto sum = 0;
	int res_type = SQLITE_INTEGER;
	for (int i = 0; i < argc; ++i) {
		int type = sqlite3_value_type(argv[i]);
		if (type == SQLITE_NULL) {
			res_type = SQLITE_NULL;
		} else {
			sum += sqlite3_value_int(argv[i]);
		}
	}
	if (res_type == SQLITE_NULL) {
		sqlite3_result_null(context);
	} else {
		sqlite3_result_int(context, sum);
	}
}